

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  GLValue max_;
  TestNode *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  MultiVertexArrayTest *this_01;
  long lVar4;
  long lVar5;
  bool bVar6;
  GLValue GVar7;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  long local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  pointer pAStack_d0;
  pointer local_c8;
  TestNode *local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  lVar5 = 0;
  local_c0 = (TestNode *)this;
  do {
    local_f8 = 0;
    local_b8 = lVar5;
    do {
      local_f0 = 0;
      do {
        lVar4 = 0;
        do {
          if (lVar4 == 0) {
            iVar1 = deqp::gls::Array::inputTypeSize((&DAT_01c28e80)[lVar5]);
            iVar1 = iVar1 * 2;
          }
          else {
            iVar1 = *(int *)((long)&DAT_01c28e8c + lVar4);
          }
          type = (&DAT_01c28e80)[lVar5];
          iVar2 = deqp::gls::Array::inputTypeSize(type);
          if (iVar1 % iVar2 == 0) {
            iVar2 = *(int *)(&DAT_01c05fa0 + local_f8 * 4);
            iVar3 = deqp::gls::Array::inputTypeSize(type);
            bVar6 = iVar2 % iVar3 == 0;
          }
          else {
            bVar6 = false;
          }
          iVar2 = *(int *)(&DAT_01c05fa0 + local_f8 * 4);
          GVar7 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar7.field_1;
          local_80 = GVar7.type;
          GVar7 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar7.field_1;
          local_90 = GVar7.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar7._4_4_ = uStack_7c;
          GVar7.type = local_80;
          GVar7.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,iVar2,iVar1,
                     false,GVar7,max_);
          local_d8 = (pointer)0x0;
          pAStack_d0 = (pointer)0x0;
          local_c8 = (pointer)0x0;
          local_e8._0_4_ = PRIMITIVE_TRIANGLES;
          local_e8._4_4_ = (&DAT_01c06180)[local_f0];
          local_e8._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_d8,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_b0,(Spec *)local_e8);
          lVar5 = local_b8;
          this_00 = local_c0;
          if (!bVar6) {
            this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_01,this_00->m_testCtx,(RenderContext *)this_00[1]._vptr_TestNode[1],
                       (Spec *)local_e8,local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
            tcu::TestNode::addChild(this_00,(TestNode *)this_01);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != (pointer)0x0) {
            operator_delete(local_d8,(long)local_c8 - (long)local_d8);
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0xc);
        lVar4 = local_f0 + 1;
        bVar6 = local_f0 == 0;
        local_f0 = lVar4;
      } while (bVar6);
      local_f8 = local_f8 + 1;
    } while (local_f8 != 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return (int)lVar4;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
					const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && ((offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	2,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}